

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImVector<float> *this;
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ImGuiContext *pIVar4;
  int iVar5;
  float *v;
  float *pfVar6;
  bool bVar7;
  float w_item_last;
  float w_item_one;
  
  pIVar4 = GImGui;
  fVar1 = (GImGui->Style).ItemInnerSpacing.x;
  auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)((w_full - fVar1 * (float)(components + -1)) /
                                            (float)components)));
  auVar3 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar2);
  auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)(w_full - (fVar1 + auVar3._0_4_) *
                                                      (float)(components + -1))));
  auVar2 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar2);
  _w_item_last = CONCAT44(auVar3._0_4_,auVar2._0_4_);
  this = &(GImGui->CurrentWindow->DC).ItemWidthStack;
  v = &(GImGui->CurrentWindow->DC).ItemWidth;
  ImVector<float>::push_back(this,v);
  ImVector<float>::push_back(this,&w_item_last);
  iVar5 = 2;
  if (2 < components) {
    iVar5 = components;
  }
  iVar5 = iVar5 + -2;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    ImVector<float>::push_back(this,&w_item_one);
  }
  pfVar6 = &w_item_one;
  if (components == 1) {
    pfVar6 = &w_item_last;
  }
  *v = *pfVar6;
  *(byte *)&(pIVar4->NextItemData).Flags = (byte)(pIVar4->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 2; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = (components == 1) ? w_item_last : w_item_one;
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}